

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsMouseDragging(ImGuiMouseButton button,float lock_threshold)

{
  int in_EDI;
  ImGuiContext *g;
  float in_stack_ffffffffffffffe0;
  uint3 in_stack_ffffffffffffffe4;
  uint button_00;
  bool local_1;
  
  button_00 = (uint)in_stack_ffffffffffffffe4;
  if (-1 < in_EDI) {
    button_00 = CONCAT13(in_EDI < 5,in_stack_ffffffffffffffe4);
  }
  if ((char)(button_00 >> 0x18) == '\0') {
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1248,"bool ImGui::IsMouseDragging(ImGuiMouseButton, float)");
  }
  if (((GImGui->IO).MouseDown[in_EDI] & 1U) == 0) {
    local_1 = false;
  }
  else {
    local_1 = IsMouseDragPastThreshold(button_00,in_stack_ffffffffffffffe0);
  }
  return local_1;
}

Assistant:

bool ImGui::IsMouseDragging(ImGuiMouseButton button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (!g.IO.MouseDown[button])
        return false;
    return IsMouseDragPastThreshold(button, lock_threshold);
}